

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::uptime_cmd(int cid,char **args,int argc)

{
  uint uVar1;
  int iVar2;
  clientinfo *pcVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  string msg;
  string buf;
  stringformatter local_268;
  uint local_25c;
  ulong local_258;
  clientinfo *local_250;
  char local_248 [259];
  undefined1 local_145;
  char local_138 [264];
  
  iVar2 = QServ::getSender(&qs);
  pcVar3 = QServ::getClient(&qs,iVar2);
  strncpy(local_248,"\f7Server Mod: \f3QServ\f7: \f1https://github.com/deathstar/QServ2020",0x104);
  local_145 = 0;
  if (pcVar3 == (clientinfo *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = pcVar3->clientnum;
  }
  sendf(iVar2,1,"ris",0x23,local_248);
  strncpy(local_248,"\f7Server Architecture: \f0GNU/Linux ",0x104);
  local_145 = 0;
  sVar4 = strlen(local_248);
  if (sVar4 < 0x104) {
    strncpy(local_248 + sVar4,"x86 (64 bit)",0x104 - sVar4);
    local_145 = 0;
  }
  local_250 = pcVar3;
  sVar4 = strlen(local_248);
  if (sVar4 < 0x104) {
    strncpy(local_248 + sVar4,"\n\f7Server Uptime:\f6",0x104 - sVar4);
    local_145 = 0;
  }
  uVar6 = totalsecs % 0x278d00;
  uVar8 = (uint)((ulong)uVar6 * 0x377af >> 0x25);
  uVar7 = uVar6 + uVar8 * -0x93a80;
  uVar11 = (uint)((ulong)uVar7 * 0xc22e5 >> 0x24);
  uVar10 = uVar7 + uVar11 * -0x15180;
  local_258 = (ulong)uVar10 * 0x123457 >> 0x20;
  uVar9 = uVar10 + (int)((ulong)uVar10 * 0x123457 >> 0x20) * -0xe10;
  local_25c = uVar9 * 0x889 >> 0x11;
  if (0x278cff < (ulong)totalsecs) {
    local_268.buf = local_138;
    pcVar5 = "";
    if (0x4f19ff < totalsecs) {
      pcVar5 = "s";
    }
    stringformatter::operator()(&local_268," %u month%s",(ulong)totalsecs / 0x278d00,pcVar5);
    sVar4 = strlen(local_248);
    if (sVar4 < 0x104) {
      strncpy(local_248 + sVar4,local_138,0x104 - sVar4);
      local_145 = 0;
    }
  }
  uVar1 = local_25c;
  if (0x93a7f < uVar6) {
    local_268.buf = local_138;
    pcVar5 = "";
    if (0x1274ff < uVar6) {
      pcVar5 = "s";
    }
    stringformatter::operator()(&local_268," %u week%s",(ulong)uVar8,pcVar5);
    sVar4 = strlen(local_248);
    if (sVar4 < 0x104) {
      strncpy(local_248 + sVar4,local_138,0x104 - sVar4);
      local_145 = 0;
    }
  }
  if (0x1517f < uVar7) {
    local_268.buf = local_138;
    pcVar5 = "";
    if (0x2a2ff < uVar7) {
      pcVar5 = "s";
    }
    stringformatter::operator()(&local_268," %u day%s",(ulong)uVar11,pcVar5);
    sVar4 = strlen(local_248);
    if (sVar4 < 0x104) {
      strncpy(local_248 + sVar4,local_138,0x104 - sVar4);
      local_145 = 0;
    }
  }
  pcVar3 = local_250;
  if (0xe0f < uVar10) {
    local_268.buf = local_138;
    pcVar5 = "";
    if (0x1c1f < uVar10) {
      pcVar5 = "s";
    }
    stringformatter::operator()(&local_268," %u hour%s",local_258,pcVar5);
    sVar4 = strlen(local_248);
    if (sVar4 < 0x104) {
      strncpy(local_248 + sVar4,local_138,0x104 - sVar4);
      local_145 = 0;
    }
  }
  uVar6 = uVar9 + uVar1 * -0x3c & 0xffff;
  if (0x3b < uVar9) {
    local_268.buf = local_138;
    pcVar5 = "";
    if (0x77 < uVar9) {
      pcVar5 = "s";
    }
    stringformatter::operator()(&local_268," %u minute%s",(ulong)local_25c,pcVar5);
    sVar4 = strlen(local_248);
    if (sVar4 < 0x104) {
      strncpy(local_248 + sVar4,local_138,0x104 - sVar4);
      local_145 = 0;
    }
  }
  if (uVar6 != 0) {
    local_268.buf = local_138;
    pcVar5 = "s";
    if (uVar6 == 1) {
      pcVar5 = "";
    }
    stringformatter::operator()(&local_268," %u second%s",(ulong)uVar6,pcVar5);
    sVar4 = strlen(local_248);
    if (sVar4 < 0x104) {
      strncpy(local_248 + sVar4,local_138,0x104 - sVar4);
      local_145 = 0;
    }
  }
  if (pcVar3 == (clientinfo *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = pcVar3->clientnum;
  }
  sendf(iVar2,1,"ris",0x23,local_248);
  return;
}

Assistant:

QSERV_CALLBACK uptime_cmd(p) {
        clientinfo *ci = qs.getClient(CMD_SENDER);
        string msg, buf;
        uint t, months, weeks, days, hours, minutes, seconds;
        copystring(msg,"\f7Server Mod: \f3QServ\f7: \f1https://github.com/deathstar/QServ2020");
        sendf(ci ? ci->clientnum : -1, 1, "ris", N_SERVMSG, msg);
        copystring(msg, "\f7Server Architecture: \f0"
        /* Firstly determine OS */
        #if !(defined(_WIN32) || defined(WIN32) || defined(WIN64) || defined(_WIN64))
        /* unix/posix compilant os */
        #   if defined(__linux__) || defined(__linux) || defined(linux) || defined(__gnu_linux__)
                   "GNU/Linux"
        #   elif defined(__GNU__) || defined(__gnu_hurd__)
                   "GNU/Hurd"
        #   elif defined(__FreeBSD_kernel__) && defined(__GLIBC__)
                   "GNU/FreeBSD"
        #   elif defined(__FreeBSD__) || defined(__FreeBSD_kernel__)
                   "FreeBSD"
        #   elif defined(__OpenBSD__)
                   "OpenBSD"
        #   elif defined(__NetBSD__)
                   "NetBSD"
        #   elif defined(__sun) || defined(sun)
                   "Solaris"
        #   elif defined(__DragonFly__)
                   "DragonFlyBSD"
        #   elif defined(__MACH__)
        #       if defined(__APPLE__)
                   "Apple"
        #       else
                   "Mach"
        #       endif
        #   elif defined(__CYGWIN__)
                   "Cygwin"
        #   elif defined(__unix__) || defined(__unix) || defined(unix) || defined(_POSIX_VERSION)
                   "UNIX"
        #   else
                   "unknown"
        #   endif
        #else
                   /* Windows */
                   "Windows"
        #endif
                   " "
                   );
        concatstring(msg, (sizeof(void *) == 8) ? "x86 (64 bit)" : "i386");
        concatstring(msg, "\n\f7Server Uptime:\f6");
        t = totalsecs;
        
        months = t / (30*24*60*60);
        
        t = t % (30*24*60*60);
        
        weeks = t / (7*24*60*60);
        
        t = t % (7*24*60*60);
        
        days = t / (24*60*60);
        
        t = t % (24*60*60);
        
        hours = t / (60*60);
        
        t = t % (60*60);
        
        minutes = t / 60;
        
        t = t % 60;
        
        seconds = t;
    
        if(months)
        {
            formatstring(buf)(" %u month%s", months, months > 1 ? "s" : "");
            concatstring(msg, buf);
        }
        
        if(weeks)
        {
            formatstring(buf)(" %u week%s", weeks, weeks > 1 ? "s" : "");
            concatstring(msg, buf);
        }

        if(days)
        {
            formatstring(buf)(" %u day%s", days, days > 1 ? "s" : "");
            concatstring(msg, buf);
        }
        
        if(hours)
        {
            formatstring(buf)(" %u hour%s", hours, hours > 1 ? "s" : "");
            concatstring(msg, buf);
        }
          
        if(minutes)
        {
            formatstring(buf)(" %u minute%s", minutes, minutes > 1 ? "s" : "");
            concatstring(msg, buf);
        }
        
        if(seconds)
        {
            formatstring(buf)(" %u second%s", seconds, seconds > 1 ? "s" : "");
            concatstring(msg, buf);
        }
        sendf(ci ? ci->clientnum : -1, 1, "ris", N_SERVMSG, msg);
    }

     QSERV_CALLBACK whois_cmd(p) {
        #include <stdio.h>

        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    sendinfo:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            char *ip = toip(cn), lmsg[3][255];
                            const char *location;

                            if(!strcmp("127.0.0.1", ip)) {
                                location = (char*)"localhost";
                            } else {
                                location = qs.cgip(ip).c_str(); //qs.congeoip(ip); <-- just country

                                if(!location) {
                                    sprintf(lmsg[1], "%s", "Unknown Location");
                                }
                            }
                            if(location) sprintf(lmsg[1], "%s", location);
                            (CMD_SCI.privilege == PRIV_ADMIN) ? sprintf(lmsg[0], "%s (%s)", lmsg[1], ip) : sprintf(lmsg[0], "%s", lmsg[1]);
                            if(qs.enable_HTTP_geo) {
                                try
                                {
                                    defformatstring(r_str)("%s%s%s", "http://ip-api.com/line/", ip, "?fields=city,regionName,country");
                                    http::Request req(r_str);
                                    const http::Response res = req.send("GET");
                                    std::string s(res.body.begin(), res.body.end());
                                    RString(s, "\n", " > ");
                                    UTFEncode(s);
                                    s.erase(s.length()-2, 2);
                                    defformatstring(msg)("Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s", colorname(ci), ci->clientnum, s.c_str());
                                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
                                    if(CMD_SCI.privilege == PRIV_ADMIN){
                                        defformatstring(amsg)("IP: \f2%s", ip);
                                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, amsg);
                                    }
                                }
                                catch (const std::exception& e)
                                {
                                    std::cerr << "HTTP geolocation localhost connect or failed with: " << e.what() << '\n';
                                }
                            }
                            else {
                                 defformatstring(s)("Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",colorname(ci), ci->clientnum,lmsg[0]);
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, s);
                            }
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto sendinfo;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    extern void forcespectator(clientinfo *ci);
    extern void unspectate(clientinfo *ci);
     QSERV_CALLBACK togglelockspec_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    lockspecprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                        
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                if(!ci->isSpecLocked) {
                                    forcespectator(ci);
                                    ci->isSpecLocked = true;
                                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3You have been locked in spectator mode.");
                            } else if(ci->isSpecLocked) {
                                    unspectate(ci);
                                    ci->isSpecLocked = false;
                                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3You are no longer locked in spectator mode.");
                        }
            
                    }
                           
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto lockspecprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
      QSERV_CALLBACK forcespectator_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    forcespectatorprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                                if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                clientinfo *ci = qs.getClient(cn);
                                forcespectator(ci);
                        }

                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto forcespectatorprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    QSERV_CALLBACK unspectate_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    unspectateprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                clientinfo *ci = qs.getClient(cn);
                                   unspectate(ci);
                        }

                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto unspectateprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    QSERV_CALLBACK mute_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    muteprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                ci->isMuted = true;
                                defformatstring(mutemsg)("\f0%s \f7has been \f3muted", colorname(ci));
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, mutemsg);
                            }
                        }
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto muteprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
     QSERV_CALLBACK unmute_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    unmuteprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                ci->isMuted = false;
                                defformatstring(unmutemsg)("\f0%s \f7has been \f0unmuted", colorname(ci));
                                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, unmutemsg);
                            }
                            
                       }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto unmuteprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }

    QSERV_CALLBACK editmute_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    editmuteprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                             if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                ci->isEditMuted = true;
                                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f7Your edits \f3will not \f7show up to others.");
                                   defformatstring(mutemsg)("\f0%s\f7's edits have been \f3muted", colorname(ci));
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, mutemsg);
                                }
                                                   
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto editmuteprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    QSERV_CALLBACK uneditmute_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    uneditmuteprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                        
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f7Your edits \f0will \f7now show up to others.");
                                ci->isEditMuted = false;
                                out(ECHO_SERV,"\f0%s\f7's edits have been \f0unmuted", colorname(ci));
                            }
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto uneditmuteprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    QSERV_CALLBACK forgive_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    forgiveprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            clientinfo *self = qs.getClient(CMD_SENDER);
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                if(ci->state.teamkills >= 1) {
                                    defformatstring(forgivemsg)("\f0%s \f7has forgiven \f3%s", colorname(self), colorname(ci));
                                    sendf(-1, 1, "ris", N_SERVMSG, forgivemsg);
                                }
                                else {
                                    defformatstring(nk)("\f3Error: %s has not teamkilled anyone yet", colorname(ci));
                                    sendf(-1, 1, "ris", N_SERVMSG, nk);
                                }
                            }
                            
                       }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto forgiveprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    SVAR(ircoperators, "");
     QSERV_CALLBACK cheater_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    cheaterprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                        
                        clientinfo *self = qs.getClient(CMD_SENDER);
                        if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && cn != NULL && ci != NULL && ci->connected && args[1]!=NULL) {
                        int accuracy = (ci->state.damage*100)/max(ci->state.shotdamage, 1);
                        privilegemsg(PRIV_MASTER,"\f7Something's fishy! A cheater has been reported.");
                         out(ECHO_SERV, "\f0%s \f7accuses \f3%s \f7(CN: \f6%d \f7| Accuracy: \f6%d%%\f7) of cheating.", colorname(self), colorname(ci), ci->clientnum, accuracy);
                        out(ECHO_NOCOLOR, "Attention Operator(s): %s - %s accuses %s (CN: %d | Accuracy: %d%%) of cheating.", ircoperators, colorname(self), colorname(ci), ci->clientnum, accuracy);
                        defformatstring(nocolorcheatermsg)("\f3%s \f7has been reported.", colorname(ci));
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, nocolorcheatermsg);
                    }
                           
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto cheaterprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
    QSERV_CALLBACK olangfilter_cmd(p) {
        if(CMD_SA) {
            int state = atoi(args[1]);

            if(state == 0 or state == 1) {
                qs.setoLang(state);
            } else {
                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
            }
        } else {
            defformatstring(msg)("%s", (qs.isLangWarnOn() == 1) ? "On" : "Off");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
        }
    }
        
    VAR(ircignore, 0, 0, 1);
    SVAR(contactemail, "");
    QSERV_CALLBACK callops_cmd(p) {
        //IRC enabled, notify irc-operators/masters/admins
        if(!getvar("ircignore")) {
            out(ECHO_IRC, "[Attention operator(s)]: %s: %s is in need of assistance.", ircoperators, CMD_SCI.name);
            defformatstring(toclient)("You alerted IRC operator(s): %s", ircoperators);
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, toclient);
            loopv(clients) {
                clientinfo *ci = clients[i];
                defformatstring(s)("\f6[Attention]: %s, %s is in need of assistance.", colorname(ci), CMD_SCI.name);
                if((ci->privilege == PRIV_ADMIN || ci->privilege == PRIV_MASTER) && ci->connected && ci->clientnum != CMD_SENDER) sendf(ci->clientnum, 1, "ris", N_SERVMSG, s);
            }
        }
        //IRC disabled, echo to console and notify masters/admins
        else if(getvar("ircignore")) {
            defformatstring(toclient)("\f7Admins have been notified. \nEmail: \f1%s \f7for more assistance.",contactemail);
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, toclient);
            out(ECHO_CONSOLE, "[Attention operator(s)]: %s: %s is in need of assistance.", ircoperators, CMD_SCI.name);
            loopv(clients) {
                clientinfo *ci = clients[i];
                defformatstring(s)("\f6[Attention]: %s, %s is in need of assistance.", colorname(ci), CMD_SCI.name);
                if((ci->privilege == PRIV_ADMIN || ci->privilege == PRIV_MASTER) && ci->connected && ci->clientnum != CMD_SENDER) sendf(ci->clientnum, 1, "ris", N_SERVMSG, s);
            }
        }
        //Variable for ircignore function handler, set ircignore to -1 to disable master/admin/irc notifications
        else {
            defformatstring(toclient)("\f7Sorry, No operators are available currently. \nEmail: \f1%s \f7for more assistance.",contactemail);
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, toclient);
        }
    }
    
    SVAR(qserv_version, "");
    QSERV_CALLBACK getversion_cmd(p) {
    defformatstring(ver)("\f7Running \f3QServ \f7(\f2%s\f7): \f1www.github.com/deathstar/QServ2020", qserv_version);
    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, ver);
    }
    
    QSERV_CALLBACK forceintermission_cmd(p) {bool intermission = false; if(!intermission){startintermission(); defformatstring(msg)("\f0%s \f7forced an intermission",CMD_SCI.name);sendf(-1, 1, "ris", N_SERVMSG, msg); out(ECHO_IRC,"%s forced an intermission",CMD_SCI.name);}}

    QSERV_CALLBACK me_cmd(p) {
        if(strlen(fulltext) > 0) {
            qs.checkoLang(CMD_SENDER, fulltext);
            defformatstring(msg)("\f0%s \f7%s", CMD_SCI.name, fulltext);
            sendf(-1, 1, "ris", N_SERVMSG, msg);
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }
    
    QSERV_CALLBACK echo_cmd(p) {
        if(strlen(fulltext) > 0) {
            out(ECHO_SERV, "%s", fulltext);
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }
    
    QSERV_CALLBACK pm_cmd(p) {
        int cn = -1;
        if(args[1] != NULL && strlen(fulltext) > 0) {
            cn = atoi(args[1]);
            clientinfo *ci = qs.getClient(cn);
            if(strlen(fulltext) > 0 && cn!=CMD_SENDER && ci != NULL && cn >= 0 && cn <= 128 && args[1] != NULL) {
                clientinfo *self = qs.getClient(CMD_SENDER);
                if(strlen(fulltext) > 0 && ci->connected && args[1] != NULL && ci != NULL) {
                    char* privatemessage = fulltext + 1; //ommit cn from fulltext
                    defformatstring(recieverpmmsg)("\f7Private message from \f0%s\f7:\f3%s", colorname(self), privatemessage);
                    sendf(cn, 1, "ris", N_SERVMSG, recieverpmmsg);
                    defformatstring(senderpmconf)("\f7Sent \f0%s \f7your message:\f3%s", colorname(ci), privatemessage);
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, senderpmconf);
                }
            }
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }
    
    QSERV_CALLBACK sendprivs_cmd(p) {
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                clientinfo *ci = qs.getClient(cn);
                clientinfo *self = qs.getClient(CMD_SENDER);
                
                if(ci != NULL) {
                    if(ci->connected && getvar("enablemultiplemasters") == true) {
                        defformatstring(shareprivsmsg)("\f7Ok, %s\f7. Sharing your privileges with \f0%s\f7.", colorname(self), colorname(ci));
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, shareprivsmsg);
                        if(self->privilege==PRIV_MASTER) {
                            defformatstring(sendprivsmsg)("\f7You have received \f0master \f7from \f0%s\f7.", colorname(self));
                            sendf(cn, 1, "ris", N_SERVMSG, sendprivsmsg);
                            server::setmaster(ci, 1, "", NULL, NULL, PRIV_MASTER, true, false);
                        }
                        else if(self->privilege==PRIV_ADMIN) {
                            defformatstring(sendprivsmsg)("\f7You have received \f6admin \f7from \f6%s\f7.", colorname(self));
                            sendf(cn, 1, "ris", N_SERVMSG, sendprivsmsg);
                            server::setmaster(ci, 1, "", NULL, NULL, PRIV_ADMIN, true, false);
                        }
                    }
                    else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: This server has disabled the multiple masters feature");
                    }
                } else {
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                }
            }
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }
    
    QSERV_CALLBACK help_cmd(p) {
        if(CMD_SA) {
            int lastcmd = -1;
            char command[50];
            
            sprintf(command, "%c%s", commandprefix, args[1]);
            if(strlen(command) > 0) {
                for(int i = 0; i < CMD_LAST; i++) {
                    if(!strcmp(CMD_NAME(i), command)) {
                        lastcmd = i;
                        break;
                    }
                }
            }
            
            if(CMD_SCI.privilege >= qs.getCommandPriv(lastcmd)) {
                if(lastcmd > -1) {
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(lastcmd));
                } else {
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Command not found. \nUse \f2\"#help\" \f3for a list of commands or \f2\"#help <name-ofcommand>\" \f3for usage.");
                }
            } else {
                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Insufficient permissions to view command info");
            }
        } else {
            static char colors[2], commandList[2056] = {0};
            int color = -1;
            strcpy(commandList, "");
            clientinfo *ci = qs.getClient(CMD_SENDER);
            if(ci->privilege==PRIV_ADMIN) {
                sprintf(commandList, "%s", "\f2Commands: \f7");
                for(int i = 0; i < CMD_LAST; i++) {
                    if(CMD_PRIV(i) == PRIV_ADMIN || CMD_PRIV(i) == PRIV_MASTER || CMD_PRIV(i) == PRIV_NONE) {
                        strcat(commandList, CMD_NAME(i));
                        if(i != CMD_LAST-1) {
                            strcat(commandList, " ");
                        }
                    }
                }
            }
            else if(ci->privilege==PRIV_MASTER) {
                sprintf(commandList, "%s", "\f2Commands: \f7");
                for(int i = 0; i < CMD_LAST; i++) {
                    if(CMD_PRIV(i) == PRIV_MASTER || CMD_PRIV(i) == PRIV_NONE) {
                        strcat(commandList, CMD_NAME(i));
                        if(i != CMD_LAST-1) {
                            strcat(commandList, " ");
                        }
                    }
                }
            }
            else if(ci->privilege==PRIV_NONE) {
                sprintf(commandList, "%s", "\f2Commands: \f7");
                for(int i = 0; i < CMD_LAST; i++) {
                    if(CMD_PRIV(i) == PRIV_NONE) {
                        strcat(commandList, CMD_NAME(i));
                        if(i != CMD_LAST-1) {
                            strcat(commandList, " ");
                        }
                    }
                }
                
                /*for(int i = 0; i < CMD_LAST; i++) {
                 if(CMD_PRIV(i) == PRIV_NONE) {
                 color = 7;
                 } else if(CMD_PRIV(i) == PRIV_MASTER) {
                 color = 0;
                 } else if(CMD_PRIV(i) == PRIV_ADMIN) {
                 color = 6;
                 }
                 sprintf(colors, "\f%d", color);
                 strcat(commandList, colors);
                 //strcat(commandList, CMD_NAME(i));
                 }
                 */
            }
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, commandList);
        }
    }
    
#include <iostream>
#include <string>
#include <stdio.h>
#include <time.h>
    QSERV_CALLBACK localtime_cmd(p) {
          time_t rawtime; time (&rawtime);
          defformatstring(localtime)("Local server time: %s", ctime (&rawtime));
        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, localtime);
    }

    QSERV_CALLBACK time_cmd(p) {
        int UTCOffset = -1;
        if(CMD_SA) {
            UTCOffset = atoi(args[1]);
            if(UTCOffset != NULL && args[1] != NULL) {
                #define UTC (0)
                time_t rawtime;
                struct tm * ptm;
                time ( &rawtime );
                ptm = gmtime ( &rawtime );
                //tm_isdst is not accurate nor reliable for UTC applications. UTC time is tm_hour without UTCOffset variable
                defformatstring(TimeOffset)("Time for UTC (%d): %2d:%02d\n", UTCOffset, (ptm->tm_hour+UTCOffset)%24, ptm->tm_min);
                defformatstring(TimeOffsetDST)("Time for UTC (%d) with Daylight Savings Time: %2d:%02d\n", UTCOffset, (ptm->tm_hour+UTCOffset+1)%24, ptm->tm_min);
                defformatstring(TimeOutput)("%s%s", TimeOffset, TimeOffsetDST);
                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, TimeOutput);
            }
            else sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "Please enter a time zone number");
        }
        else sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));

    }

    QSERV_CALLBACK bunny_cmd(p) {
        if(strlen(fulltext) > 0) {
            
            defformatstring(msg)("%s \f0%s: \f7%s", bunny, "Tip", fulltext);
            sendf(-1, 1, "ris", N_SERVMSG, msg);
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }

    QSERV_CALLBACK owords_cmd(p) {
        char owordList[1024] = "Offensive words (words not to say): ";
        char colors[10];

        for(int i = 0; i < 50; i++) {
            if(strlen(owords[i]) > 0) {
                sprintf(colors, "\f%d", 3);
                strcat(owordList, colors);
                strcat(owordList, owords[i]);
                strcat(owordList, "\f2, ");
            }
        }
        owordList[strlen(owordList)-2] = '\0';
        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, owordList);
    }

     QSERV_CALLBACK stats_cmd(p) {
        #include <stdio.h>
         
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    sendstats:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            char *ip = toip(cn), lmsg[3][255];
                            const char *location;

                            if(!strcmp("127.0.0.1", ip)) {
                                location = (char*)"localhost";
                            } else {
                                location = qs.cgip(ip).c_str(); //qs.congeoip(ip); <-- just country

                                if(!location) {
                                    sprintf(lmsg[1], "%s", "Unknown Location");
                                }
                            }
                            string buf;
                            char msg[MAXTRANS];
                            
                            formatstring(msg)("\f7Stats for \f0%s\f7: cn: \f2%d \f7frags: \f2%i \f7deaths: \f2%i \f7suicides: \f2%i \f7kpd: \f2%.2f \f7acc: \f2%i%%",
                                              colorname(ci), ci->clientnum, ci->state.frags, ci->state.deaths, ci->state._suicides,
                                              (float(ci->state.frags)/float(max(ci->state.deaths, 1))), ci->state.damage*100/max(ci->state.shotdamage,1));
                            if(server::q_teammode)
                            {
                                formatstring(buf)("\n\f7teamkills: \f2%i \f7flags scored: \f2%i \f7flags stolen: \f2%i \f7flags returned: \f2%i", ci->state.teamkills, ci->state.flags, ci->state._stolen, ci->state._returned);
                                concatstring(msg, buf, MAXTRANS);
                            }
                            formatstring(buf)("\n\f7shotgun: \f2%i%% \f7chaingun: \f2%i%% \f7rocketlauncher: \f2%i%% \f7rifle: \f2%i%% \f7grenadelauncher: \f2%i%% \f7pistol: \f2%i%%",
                            getwepaccuracy(ci->clientnum, 1), getwepaccuracy(ci->clientnum, 2), getwepaccuracy(ci->clientnum, 3),
                            getwepaccuracy(ci->clientnum, 4), getwepaccuracy(ci->clientnum, 5), getwepaccuracy(ci->clientnum, 6));
                            concatstring(msg, buf, MAXTRANS);
                            
                            send_connected_time(ci, CMD_SENDER);
                            
                            if(location) sprintf(lmsg[1], "%s", location);
                            (CMD_SCI.privilege == PRIV_ADMIN) ? sprintf(lmsg[0], "%s (%s)", lmsg[1], ip) :
                            sprintf(lmsg[0], "%s", lmsg[1]);
                            
                            if(qs.enable_HTTP_geo) {
                                try
                                {
                                    defformatstring(r_str)("%s%s%s", "http://ip-api.com/line/", ip, "?fields=city,regionName,country");
                                    http::Request req(r_str);
                                    const http::Response res = req.send("GET");
                                    std::string s(res.body.begin(), res.body.end());
                                    RString(s, "\n", " > ");
                                    UTFEncode(s);
                                    s.erase(s.length()-2, 2);
                                    formatstring(buf)("\n\f7location: \f6%s", s.c_str());
                                    concatstring(msg, buf, MAXTRANS);
                                }
                                catch (const std::exception& e)
                                {
                                    std::cerr << "HTTP geolocation localhost connect or failed with: " << e.what() << '\n';
                                }
                            }
                            else {
                                formatstring(buf)("\n\f7location: \f6%s", lmsg[0]);
                                concatstring(msg, buf, MAXTRANS);
                            }
                            
                            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto sendstats;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }
    
                    
    QSERV_CALLBACK revokepriv_cmd(p) {
        int cn = -1;
    
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                clientinfo *ci = qs.getClient(cn);
                clientinfo *cisender = qs.getClient(CMD_SENDER);
                
                if(ci != NULL) {
                    if(ci->connected) {
                        //server::revokemaster(ci);
                        defformatstring(msg)("Privileges have been revoked from the specified client \f3%s", colorname(ci));
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
                        setmaster(ci, NULL, "", NULL, NULL, PRIV_NONE, true, false);
                    }
                } else {
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                }
            }
        } else {
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
        }
    }
}